

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetics-observer.cpp
# Opt level: O3

void __thiscall
stateObservation::KineticsObserver::setContactProcessCovMat
          (KineticsObserver *this,int contactNbr,Matrix12 *contactCovMat)

{
  ExtendedKalmanFilter *pEVar1;
  double *pdVar2;
  pointer pCVar3;
  double dVar4;
  ulong uVar5;
  Matrix P;
  DenseStorage<double,__1,__1,__1,_0> local_58;
  Matrix local_38;
  
  pEVar1 = &this->ekf_;
  (*(this->ekf_).super_KalmanFilterBase.super_ZeroDelayObserver.super_ObserverBase.
    _vptr_ObserverBase[0x32])(&local_38,pEVar1);
  local_58.m_data = (double *)0x0;
  local_58.m_rows = 0;
  local_58.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_58,0x90,0xc,0xc);
  if ((local_58.m_rows != 0xc) || (local_58.m_cols != 0xc)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_58,0x90,0xc,0xc);
    if ((local_58.m_rows != 0xc) || (local_58.m_cols != 0xc)) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 12, 12>, T1 = double, T2 = double]"
                   );
    }
  }
  uVar5 = 0xfffffffffffffffe;
  do {
    pdVar2 = (contactCovMat->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>).
             m_storage.m_data.array + uVar5 + 2;
    dVar4 = pdVar2[1];
    local_58.m_data[uVar5 + 2] = *pdVar2;
    (local_58.m_data + uVar5 + 2)[1] = dVar4;
    uVar5 = uVar5 + 2;
  } while (uVar5 < 0x8e);
  if ((uint)contactNbr < this->maxContacts_) {
    pCVar3 = (this->contacts_).
             super__Vector_base<stateObservation::KineticsObserver::Contact,_Eigen::aligned_allocator<stateObservation::KineticsObserver::Contact>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pCVar3[(uint)contactNbr].isSet != false) {
      setBlockStateCovariance<12>
                (&local_38,(Matrix *)&local_58,pCVar3[(uint)contactNbr].stateIndexTangent);
      free(local_58.m_data);
      (*(pEVar1->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.
        _vptr_ObserverBase[0x31])(pEVar1,&local_38);
      free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      return;
    }
    __assert_fail("contacts_[contactNbr].isSet && \"The requested contact is not set yet, please add it before\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamics-estimators/kinetics-observer.hxx"
                  ,0x9c,
                  "unsigned int stateObservation::KineticsObserver::contactIndexTangent(unsigned int) const"
                 );
  }
  __assert_fail("contactNbr < maxContacts_ && \"The requested contact number is higher than the maximum\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/dynamics-estimators/kinetics-observer.hxx"
                ,0x9a,
                "unsigned int stateObservation::KineticsObserver::contactIndexTangent(unsigned int) const"
               );
}

Assistant:

void KineticsObserver::setContactProcessCovMat(int contactNbr, const Matrix12 & contactCovMat)
{
  Matrix P = ekf_.getProcessCovariance();
  setBlockStateCovariance<sizeContactTangent>(P, contactCovMat, contactIndexTangent(contactNbr));
  ekf_.setProcessCovariance(P);
}